

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_centaur.c
# Opt level: O0

intel_code_and_bits_t get_brand_code_and_bits(cpu_id_t *data)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  intel_code_and_bits_t iVar5;
  ulong local_1a8;
  anon_struct_16_2_33b192f2 bit_matchtable [11];
  anon_struct_16_2_e9f7261c_conflict matchtable [10];
  size_t n;
  char *s;
  char *bs;
  ulong uStack_30;
  int i;
  uint64_t bits;
  intel_code_t code;
  cpu_id_t *data_local;
  intel_code_and_bits_t result;
  
  bits._4_4_ = 1;
  uStack_30 = 0;
  pcVar4 = data->brand_str;
  sVar3 = strlen(pcVar4);
  memcpy(&bit_matchtable[10].search,&DAT_0013ac30,0xa0);
  memcpy(&local_1a8,&DAT_0013acd0,0xb0);
  for (bs._4_4_ = 0; uVar1 = uStack_30, bs._4_4_ < 0xb; bs._4_4_ = bs._4_4_ + 1) {
    iVar2 = match_pattern(pcVar4,(char *)bit_matchtable[(int)bs._4_4_].bit);
    if (iVar2 != 0) {
      uStack_30 = (ulong)bit_matchtable[(long)(int)bs._4_4_ + -1].search | uStack_30;
    }
  }
  iVar2 = match_pattern(pcVar4,"Core(TM) [im][3579]");
  if (iVar2 == 0) {
    iVar2 = match_pattern(pcVar4,"Core(TM) [3579]");
    if (iVar2 == 0) {
      iVar2 = match_pattern(pcVar4,"Core(TM) Ultra [3579]");
      if (iVar2 == 0) {
        iVar2 = match_pattern(pcVar4,"Xeon(R) w[3579]");
        if (iVar2 == 0) {
          iVar2 = match_pattern(pcVar4,"Xeon(R) [DW]");
          if (iVar2 == 0) {
            iVar2 = match_pattern(pcVar4,"[NU]##");
            if (iVar2 != 0) {
              if (pcVar4[iVar2 + -1] == 'N') {
                uStack_30 = uStack_30 | 0x80000000;
              }
              else if (pcVar4[iVar2 + -1] == 'U') {
                uStack_30 = uStack_30 | 0x1000000000;
              }
            }
          }
          else {
            uStack_30 = uStack_30 | 0x40000;
            if (pcVar4[(long)(iVar2 + -1) + 8] == 'D') {
              uStack_30 = uVar1 | 0x1040000;
            }
            else if (pcVar4[(long)(iVar2 + -1) + 8] == 'W') {
              uStack_30 = uVar1 | 0x840000;
            }
          }
        }
        else {
          uStack_30 = uStack_30 | 0x40000;
          if (pcVar4[(long)(iVar2 + -1) + 8] == 'w') {
            uStack_30 = uVar1 | 0x840000;
          }
          switch(pcVar4[(long)(iVar2 + -1) + 9]) {
          case '3':
            uStack_30 = uStack_30 | 8;
            break;
          case '5':
            uStack_30 = uStack_30 | 0x10;
            break;
          case '7':
            uStack_30 = uStack_30 | 0x20;
            break;
          case '9':
            uStack_30 = uStack_30 | 0x40;
          }
        }
      }
      else {
        uVar1 = uStack_30 | 0x100010000;
        switch(pcVar4[(long)(iVar2 + -1) + 0xf]) {
        case '3':
          uVar1 = uStack_30 | 0x100010008;
          break;
        case '5':
          uVar1 = uStack_30 | 0x100010010;
          break;
        case '7':
          uVar1 = uStack_30 | 0x100010020;
          break;
        case '9':
          uVar1 = uStack_30 | 0x100010040;
        }
        uStack_30 = uVar1;
        for (bs._4_4_ = iVar2 + 0xf; (ulong)(long)(int)bs._4_4_ < sVar3; bs._4_4_ = bs._4_4_ + 1) {
          switch(pcVar4[(int)bs._4_4_]) {
          case 'F':
            uStack_30 = uStack_30 | 0x800;
            break;
          case 'H':
            uStack_30 = uStack_30 | 0x80;
            break;
          case 'K':
            uStack_30 = uStack_30 | 0x100000;
            break;
          case 'L':
            uStack_30 = uStack_30 | 0x400000000;
            break;
          case 'T':
            uStack_30 = uStack_30 | 0x800000000;
            break;
          case 'U':
            uStack_30 = uStack_30 | 0x200;
            break;
          case 'V':
            uStack_30 = uStack_30 | 0x200000000;
            break;
          case 'X':
            uStack_30 = uStack_30 | 0x400;
          }
        }
      }
    }
    else {
      uStack_30 = uStack_30 | 0x10000;
      switch(pcVar4[(long)(iVar2 + -1) + 9]) {
      case '3':
        uStack_30 = uVar1 | 0x10008;
        break;
      case '5':
        uStack_30 = uVar1 | 0x10010;
        break;
      case '7':
        uStack_30 = uVar1 | 0x10020;
        break;
      case '9':
        uStack_30 = uVar1 | 0x10040;
      }
      for (bs._4_4_ = iVar2 + 9; (ulong)(long)(int)bs._4_4_ < sVar3; bs._4_4_ = bs._4_4_ + 1) {
        switch(pcVar4[(int)bs._4_4_]) {
        case 'E':
          uStack_30 = uStack_30 | 0x2000;
          break;
        case 'F':
          uStack_30 = uStack_30 | 0x800;
          break;
        case 'H':
          uStack_30 = uStack_30 | 0x80;
          break;
        case 'L':
          uStack_30 = uStack_30 | 0x400000000;
          break;
        case 'T':
          uStack_30 = uStack_30 | 0x800000000;
          break;
        case 'U':
          uStack_30 = uStack_30 | 0x200;
        }
      }
    }
  }
  else {
    uStack_30 = uStack_30 | 0x10000;
    if (pcVar4[(long)(iVar2 + -1) + 9] == 'i') {
      uStack_30 = uVar1 | 0x30000;
    }
    else if (pcVar4[(long)(iVar2 + -1) + 9] == 'm') {
      uStack_30 = uVar1 | 0x10001;
    }
    switch(pcVar4[(long)(iVar2 + -1) + 10]) {
    case '3':
      uStack_30 = uStack_30 | 8;
      break;
    case '5':
      uStack_30 = uStack_30 | 0x10;
      break;
    case '7':
      uStack_30 = uStack_30 | 0x20;
      break;
    case '9':
      uStack_30 = uStack_30 | 0x40;
    }
    for (bs._4_4_ = iVar2 + 10; (ulong)(long)(int)bs._4_4_ < sVar3; bs._4_4_ = bs._4_4_ + 1) {
      switch(pcVar4[(int)bs._4_4_]) {
      case 'H':
        uStack_30 = uStack_30 | 0x80;
        break;
      case 'K':
        uStack_30 = uStack_30 | 0x100000;
        break;
      case 'N':
        uStack_30 = uStack_30 | 0x400000;
        break;
      case 'P':
        uStack_30 = uStack_30 | 0x200000;
        break;
      case 'S':
        uStack_30 = uStack_30 | 0x100;
        break;
      case 'U':
        uStack_30 = uStack_30 | 0x200;
        break;
      case 'X':
        uStack_30 = uStack_30 | 0x400;
      }
    }
  }
  if ((((uStack_30 & 0x4000) != 0) || ((uStack_30 & 0x8000) != 0)) &&
     (iVar2 = match_pattern(pcVar4,"[JN]"), iVar2 != 0)) {
    if (pcVar4[iVar2 + -1] == 'J') {
      uStack_30 = uStack_30 | 0x40000000;
    }
    else if (pcVar4[iVar2 + -1] == 'N') {
      uStack_30 = uStack_30 | 0x80000000;
    }
  }
  bs._4_4_ = 0;
  do {
    if (9 < bs._4_4_) {
LAB_00116010:
      debugf(2,"intel matchtable result is %d\n",(ulong)bits._4_4_);
      if ((uStack_30 & 0x40000) != 0) {
        iVar2 = match_pattern(pcVar4,"W35##");
        if ((iVar2 == 0) && (iVar2 = match_pattern(pcVar4,"[ELXW]75##"), iVar2 == 0)) {
          iVar2 = match_pattern(pcVar4,"[ELXW]55##");
          if (iVar2 == 0) {
            iVar2 = match_pattern(pcVar4,"[ELXW]56##");
            if (iVar2 == 0) {
              if ((0 < data->l3_cache) && ((data->field_11).x86.family == 0x10)) {
                bits._4_4_ = 0x7d1;
              }
            }
            else {
              bits._4_4_ = 0x7d4;
            }
          }
          else {
            bits._4_4_ = 0x7d3;
          }
        }
        else {
          uStack_30 = uStack_30 | 0x20;
        }
      }
      iVar2 = match_all(uStack_30,0x40004);
      if ((iVar2 != 0) && (0 < data->l3_cache)) {
        bits._4_4_ = 0x7d2;
      }
      if ((bits._4_4_ == 0x7d7) && (pcVar4 = strstr(pcVar4,"CPU"), pcVar4 != (char *)0x0)) {
        for (n = (size_t)(pcVar4 + 3); *(char *)n == ' '; n = n + 1) {
        }
        if (*(char *)n == 'T') {
          uStack_30 = uStack_30 | 2;
        }
      }
      if ((bits._4_4_ == 0x7d7) && (iVar2 = data->num_cores, iVar2 != 1)) {
        if (iVar2 == 2) {
          bits._4_4_ = 0x7d9;
          if (2 < data->num_logical_cpus) {
            bits._4_4_ = 0x7df;
          }
        }
        else if (iVar2 == 4) {
          bits._4_4_ = 0x7de;
          if (4 < data->num_logical_cpus) {
            bits._4_4_ = 0x7e0;
          }
        }
        else {
          bits._4_4_ = 0x7e1;
        }
      }
      if (((bits._4_4_ == 0x7d9) && ((uStack_30 & 2) != 0)) && ((data->field_11).x86.model != 0xe))
      {
        if ((data->field_11).x86.ext_model < 0x17) {
          bits._4_4_ = 0x7dc;
        }
        else {
          bits._4_4_ = 0x7dd;
        }
      }
      if (((data->field_11).x86.ext_model == 0x17) &&
         (((bits._4_4_ == 0x7d9 || (bits._4_4_ == 0x7e2)) || ((uStack_30 & 0x8000) != 0)))) {
        bits._4_4_ = 0x7db;
      }
      iVar5._4_4_ = 0;
      iVar5.code = bits._4_4_;
      iVar5.bits = uStack_30;
      return iVar5;
    }
    iVar2 = match_pattern(pcVar4,*(char **)(matchtable + (int)bs._4_4_));
    if (iVar2 != 0) {
      bits._4_4_ = *(uint *)&bit_matchtable[(long)(int)bs._4_4_ + 10].search;
      goto LAB_00116010;
    }
    bs._4_4_ = bs._4_4_ + 1;
  } while( true );
}

Assistant:

static centaur_code_and_bits_t get_brand_code_and_bits(struct cpu_id_t* data)
{
	centaur_code_t code = (centaur_code_t) NC;
	centaur_code_and_bits_t result;
	uint64_t bits = 0;
	int i = 0;

	const char* bs = data->brand_str;
	const struct { centaur_code_t c; const char *search; } code_matchtable[] = {
		{ VIA, "VIA" },
		{ ZHAOXIN, "ZHAOXIN" },
	};

	const struct { uint64_t bit; const char* search; } bit_matchtable_via[] = {
		{ SAMUEL_, "Samuel" },
		{ EZRA_, "Ezra" },
		{ NEHEMIAH_, "Nehemiah" },
		{ ESTHER_, "Esther" },
		{ EDEN_, "Eden" },
		{ CNA_, "CNA" },
		{ NANO_, "Nano" },
		{ QUADCORE_, "QuadCore" },
	};
	const struct { uint64_t bit; const char* search; } bit_matchtable_zhaoxin[] = {
		{ KAISHENG_, "KaisHeng" },
		{ KAIXIAN_, "KaiXian" },
		{ _KH_, "KH" },
		{ _KX_, "KX" },
		{ _ZX_, "ZX" },
		{ _C,   "-C" },
		{ _D,   "-D" },
		{ _E,   "-E" },
	};

	for (i = 0; i < COUNT_OF(code_matchtable); i++) {
		if (match_pattern(bs, code_matchtable[i].search)) {
			code = code_matchtable[i].c;
			break;
		}
	}

	if (code == VIA) {
		for (i = 0; i < COUNT_OF(bit_matchtable_via); i++) {
			if (match_pattern(bs, bit_matchtable_via[i].search))
				bits |= bit_matchtable_via[i].bit;
		}
	}
	else if (code == ZHAOXIN) {
		for (i = 0; i < COUNT_OF(bit_matchtable_zhaoxin); i++) {
			if (match_pattern(bs, bit_matchtable_zhaoxin[i].search))
				bits |= bit_matchtable_zhaoxin[i].bit;
		}
	}

	result.code = code;
	result.bits = bits;
	return result;
}